

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandPoolManager.cpp
# Opt level: O0

CommandPoolWrapper * __thiscall
Diligent::CommandPoolManager::AllocateCommandPool
          (CommandPoolWrapper *__return_storage_ptr__,CommandPoolManager *this,char *DebugName)

{
  VulkanLogicalDevice *this_00;
  bool bVar1;
  Uint32 UVar2;
  reference rhs;
  VkCommandPool_T *pVVar3;
  Char *Message;
  VkDevice device;
  undefined1 local_90 [8];
  string msg;
  undefined1 auStack_58 [8];
  VkCommandPoolCreateInfo CmdPoolCI;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> LockGuard;
  char *DebugName_local;
  CommandPoolManager *this_local;
  CommandPoolWrapper *CmdPool;
  
  LockGuard._M_device = (mutex_type *)DebugName;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->m_Mutex);
  VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>::
  VulkanObjectWrapper(__return_storage_ptr__);
  bVar1 = std::
          deque<VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>,_Diligent::STDAllocator<VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>,_Diligent::IMemoryAllocator>_>
          ::empty(&this->m_CmdPools);
  if (!bVar1) {
    rhs = std::
          deque<VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>,_Diligent::STDAllocator<VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>,_Diligent::IMemoryAllocator>_>
          ::front(&this->m_CmdPools);
    VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>
    ::operator=(__return_storage_ptr__,rhs);
    std::
    deque<VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>,_Diligent::STDAllocator<VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>,_Diligent::IMemoryAllocator>_>
    ::pop_front(&this->m_CmdPools);
    this_00 = this->m_LogicalDevice;
    pVVar3 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkCommandPool_T_
                       ((VulkanObjectWrapper *)__return_storage_ptr__);
    VulkanUtilities::VulkanLogicalDevice::ResetCommandPool(this_00,pVVar3,0);
  }
  pVVar3 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkCommandPool_T_
                     ((VulkanObjectWrapper *)__return_storage_ptr__);
  if (pVVar3 == (VkCommandPool_T *)0x0) {
    CmdPoolCI.pNext = (void *)0x0;
    auStack_58 = (undefined1  [8])0x27;
    CmdPoolCI.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    CmdPoolCI._4_4_ = 0;
    UVar2 = IndexWrapper::operator_cast_to_unsigned_int((IndexWrapper *)&this->m_QueueFamilyIndex);
    CmdPoolCI.pNext = (void *)CONCAT44(UVar2,this->m_CmdPoolFlags);
    VulkanUtilities::VulkanLogicalDevice::CreateCommandPool
              ((CommandPoolWrapper *)((long)&msg.field_2 + 8),this->m_LogicalDevice,
               (VkCommandPoolCreateInfo *)auStack_58,"");
    VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>
    ::operator=(__return_storage_ptr__,
                (VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0> *)
                ((long)&msg.field_2 + 8));
    VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>
    ::~VulkanObjectWrapper
              ((VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0> *)
               ((long)&msg.field_2 + 8));
    pVVar3 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkCommandPool_T_
                       ((VulkanObjectWrapper *)__return_storage_ptr__);
    if (pVVar3 == (VkCommandPool_T *)0x0) {
      FormatString<char[37]>
                ((string *)local_90,(char (*) [37])"Failed to create Vulkan command pool");
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"AllocateCommandPool",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandPoolManager.cpp"
                 ,0x46);
      std::__cxx11::string::~string((string *)local_90);
    }
  }
  device = VulkanUtilities::VulkanLogicalDevice::GetVkDevice(this->m_LogicalDevice);
  pVVar3 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkCommandPool_T_
                     ((VulkanObjectWrapper *)__return_storage_ptr__);
  VulkanUtilities::SetCommandPoolName(device,pVVar3,(char *)LockGuard._M_device);
  std::__atomic_base<int>::operator++(&(this->m_AllocatedPoolCounter).super___atomic_base<int>);
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return __return_storage_ptr__;
}

Assistant:

VulkanUtilities::CommandPoolWrapper CommandPoolManager::AllocateCommandPool(const char* DebugName)
{
    std::lock_guard<std::mutex> LockGuard{m_Mutex};

    VulkanUtilities::CommandPoolWrapper CmdPool;
    if (!m_CmdPools.empty())
    {
        CmdPool = std::move(m_CmdPools.front());
        m_CmdPools.pop_front();

        m_LogicalDevice.ResetCommandPool(CmdPool);
    }

    if (CmdPool == VK_NULL_HANDLE)
    {
        VkCommandPoolCreateInfo CmdPoolCI = {};

        CmdPoolCI.sType            = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
        CmdPoolCI.pNext            = nullptr;
        CmdPoolCI.queueFamilyIndex = m_QueueFamilyIndex;
        CmdPoolCI.flags            = m_CmdPoolFlags;

        CmdPool = m_LogicalDevice.CreateCommandPool(CmdPoolCI);
        DEV_CHECK_ERR(CmdPool != VK_NULL_HANDLE, "Failed to create Vulkan command pool");
    }

    VulkanUtilities::SetCommandPoolName(m_LogicalDevice.GetVkDevice(), CmdPool, DebugName);

#ifdef DILIGENT_DEVELOPMENT
    ++m_AllocatedPoolCounter;
#endif
    return CmdPool;
}